

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

xmlChar * xmlParseLookupString(xmlParserCtxtPtr ctxt,size_t startDelta,char *str,size_t strLen)

{
  xmlChar *pxVar1;
  ulong uVar2;
  size_t index;
  xmlChar *end;
  xmlChar *term;
  xmlChar *cur;
  size_t strLen_local;
  char *str_local;
  size_t startDelta_local;
  xmlParserCtxtPtr ctxt_local;
  
  if (ctxt->checkIndex == 0) {
    term = ctxt->input->cur + startDelta;
  }
  else {
    term = ctxt->input->cur + ctxt->checkIndex;
  }
  ctxt_local = (xmlParserCtxtPtr)strstr((char *)term,str);
  if (ctxt_local == (xmlParserCtxtPtr)0x0) {
    pxVar1 = ctxt->input->end;
    if ((ulong)((long)pxVar1 - (long)term) < strLen) {
      index = (size_t)term;
    }
    else {
      index = (long)pxVar1 - (strLen - 1);
    }
    uVar2 = index - (long)ctxt->input->cur;
    if (uVar2 < 0x8000000000000000) {
      ctxt->checkIndex = uVar2;
    }
    else {
      ctxt->checkIndex = 0;
      ctxt_local = (xmlParserCtxtPtr)(ctxt->input->end + -strLen);
    }
  }
  else {
    ctxt->checkIndex = 0;
  }
  return (xmlChar *)ctxt_local;
}

Assistant:

static const xmlChar *
xmlParseLookupString(xmlParserCtxtPtr ctxt, size_t startDelta,
                     const char *str, size_t strLen) {
    const xmlChar *cur, *term;

    if (ctxt->checkIndex == 0) {
        cur = ctxt->input->cur + startDelta;
    } else {
        cur = ctxt->input->cur + ctxt->checkIndex;
    }

    term = BAD_CAST strstr((const char *) cur, str);
    if (term == NULL) {
        const xmlChar *end = ctxt->input->end;
        size_t index;

        /* Rescan (strLen - 1) characters. */
        if ((size_t) (end - cur) < strLen)
            end = cur;
        else
            end -= strLen - 1;
        index = end - ctxt->input->cur;
        if (index > LONG_MAX) {
            ctxt->checkIndex = 0;
            return(ctxt->input->end - strLen);
        }
        ctxt->checkIndex = index;
    } else {
        ctxt->checkIndex = 0;
    }

    return(term);
}